

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_Sim2CheckPos(Gia_Sim2_t *p,int *piPo,int *piPat)

{
  int iVar1;
  uint *pInfo;
  bool bVar2;
  int local_34;
  int iPat;
  int i;
  Gia_Obj_t *pObj;
  int *piPat_local;
  int *piPo_local;
  Gia_Sim2_t *p_local;
  
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p->pAig);
    bVar2 = false;
    if (local_34 < iVar1) {
      _iPat = Gia_ManCo(p->pAig,local_34);
      bVar2 = _iPat != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjValue(_iPat);
    pInfo = Gia_Sim2Data(p,iVar1);
    iVar1 = Gia_Sim2InfoIsZero(p,pInfo);
    if (-1 < iVar1) {
      *piPo = local_34;
      *piPat = iVar1;
      return 1;
    }
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

static inline int Gia_Sim2CheckPos( Gia_Sim2_t * p, int * piPo, int * piPat )
{
    Gia_Obj_t * pObj;
    int i, iPat;
    Gia_ManForEachPo( p->pAig, pObj, i )
    {
        iPat = Gia_Sim2InfoIsZero( p, Gia_Sim2Data( p, Gia_ObjValue(pObj) ) );
        if ( iPat >= 0 )
        {
            *piPo = i;
            *piPat = iPat;
            return 1;
        }
    }
    return 0;
}